

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O2

bool __thiscall
chaiscript::Type_Conversions::converts(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  bool bVar1;
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *this_00;
  size_type sVar2;
  type_info *local_30;
  type_info *local_28;
  
  this_00 = thread_cache(this);
  local_28 = to->m_bare_type_info;
  sVar2 = std::
          set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          ::count(this_00,&local_28);
  if (sVar2 != 0) {
    local_30 = from->m_bare_type_info;
    sVar2 = std::
            set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
            ::count(this_00,&local_30);
    if (sVar2 != 0) {
      bVar1 = has_conversion(this,to,from);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool converts(const Type_Info &to, const Type_Info &from) const noexcept {
      const auto &types = thread_cache();
      if (types.count(to.bare_type_info()) != 0 && types.count(from.bare_type_info()) != 0) {
        return has_conversion(to, from);
      } else {
        return false;
      }
    }